

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O2

int feederBig2(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  FILE *__stream;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
LAB_00103a9a:
    iVar7 = -1;
  }
  else {
    printf("Creating a large graph...");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"5000\n1 2\n%d\n",0xbeb25b);
    uVar6 = 2;
    uVar4 = 0;
    while (uVar4 != 4999) {
      iVar7 = (int)uVar6;
      while (iVar5 = (int)uVar6, iVar5 != 0x1389) {
        if (((1 < uVar4) && (uVar4 != 0x7c0)) || ((iVar5 != 2 && (iVar5 != 0x7c1)))) {
          iVar2 = fprintf(__stream,"%d %d 2\n",(ulong)(uVar4 + 1),uVar6);
          if (iVar2 < 2) {
            puts("can\'t create in.txt. No space on disk?");
            fclose(__stream);
            goto LAB_00103a9a;
          }
        }
        uVar6 = (ulong)(iVar5 + 1);
      }
      uVar6 = (ulong)(iVar7 + 1);
      uVar4 = uVar4 + 1;
    }
    fwrite("1 1985 1\n",9,1,__stream);
    fwrite("2 1985 1\n",9,1,__stream);
    fclose(__stream);
    DVar3 = GetTickCount();
    uVar4 = RoundUptoThousand(DVar3 - DVar1);
    iVar7 = 0;
    printf("done in T=%u seconds. Starting exe with timeout T+6... ",(ulong)uVar4 / 1000,
           (ulong)uVar4 % 1000);
    LabTimeout = uVar4 + 6000;
    fflush(_stdout);
    LabMemoryLimit = 1;
  }
  return iVar7;
}

Assistant:

static int feederBig2(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    DWORD t;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    printf("Creating a large graph...");
    fflush(stdout);
    t = GetTickCount();

    fprintf(in, "5000\n1 2\n%d\n", 5000*4999/2-1);
    for (i = 0; i+1 < 5000; i++) {
        int j;
        for (j = i+1; j < 5000; j++) {
            if ((i == 0 || i == 1 || i == 1984) && (j == 0 || j == 1 || j == 1984)) {
                continue;
            }
            if (fprintf(in, "%d %d 2\n", i+1, j+1) < 2) {
                printf("can't create in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        }
    }
    fprintf(in, "1 1985 1\n");
    fprintf(in, "2 1985 1\n");
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout T+6... ", (unsigned)t/1000);
    LabTimeout = (int)t+6000;
    fflush(stdout);
    LabMemoryLimit = 5000*5000*4+MIN_PROCESS_RSS_BYTES;
    return 0;
}